

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

golf_entity_t * golf_entity_make_copy(golf_entity_t *__return_storage_ptr__,golf_entity_t *entity)

{
  golf_entity_type_t gVar1;
  golf_geo_point_t *pgVar2;
  vec_golf_geo_point_t points;
  vec_golf_geo_face_t faces;
  golf_geo_generator_data_t generator_data;
  void *pvVar3;
  int iVar4;
  sg_buffer sVar5;
  golf_entity_type_t gVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *paVar11;
  char *pcVar12;
  anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *paVar13;
  long lVar14;
  undefined8 *puVar15;
  golf_geo_t *pgVar16;
  byte bVar17;
  golf_geo_face_t face_copy;
  golf_lightmap_section_t section;
  char *local_298;
  undefined8 uStack_290;
  char *local_288;
  char *local_278;
  undefined8 uStack_270;
  char *local_268;
  char *local_258;
  undefined8 uStack_250;
  char *local_248;
  char *local_238;
  undefined8 uStack_230;
  char *local_228;
  undefined8 local_218;
  int aiStack_210 [2];
  char *local_208;
  golf_script_t *local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  void *local_1d8;
  golf_entity_t *local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  int iStack_1c0;
  undefined4 uStack_1bc;
  char *local_1b8;
  undefined8 local_1a8;
  char *pcStack_1a0;
  char *local_198;
  char *pcStack_190;
  undefined8 local_160;
  undefined8 uStack_158;
  char *local_150;
  int local_148;
  char *local_140;
  char *pcStack_138;
  char *local_130;
  undefined4 local_128;
  undefined8 local_124;
  undefined4 local_11c;
  undefined1 local_118 [16];
  undefined8 local_108;
  vec2 *pvStack_100;
  golf_geo_point_t *local_f8;
  char *pcStack_f0;
  uint32_t local_e8 [2];
  golf_geo_face_t *pgStack_e0;
  char *local_d8;
  char *pcStack_d0;
  char *local_c8;
  golf_model_group_t *pgStack_c0;
  int local_b8;
  char *local_b0;
  int local_a8;
  undefined8 local_94;
  undefined4 local_8c;
  
  bVar17 = 0;
  memcpy(__return_storage_ptr__,entity,0x510);
  gVar6 = entity->type;
  if ((gVar6 == WATER_ENTITY) || (gVar6 == GEO_ENTITY)) {
    paVar13 = &entity->field_4;
  }
  else if (gVar6 == MODEL_ENTITY) {
    paVar13 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
              &(entity->field_4).model.lightmap_section;
  }
  else {
    paVar13 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0;
  }
  gVar1 = __return_storage_ptr__->type;
  if ((gVar1 == WATER_ENTITY) || (gVar1 == GEO_ENTITY)) {
    paVar11 = &__return_storage_ptr__->field_4;
  }
  else if (gVar1 == MODEL_ENTITY) {
    paVar11 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
              &(__return_storage_ptr__->field_4).model.lightmap_section;
  }
  else {
    paVar11 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0;
  }
  if (paVar13 != (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)0x0) {
    local_298 = (char *)0x0;
    uStack_290 = (char *)0x0;
    local_288 = "level";
    iVar7 = *(int *)((long)paVar13 + 0x48);
    iVar4 = vec_reserve_po2_(&local_298,(int *)&uStack_290,(int *)((long)&uStack_290 + 4),8,iVar7,
                             "level");
    if (iVar4 == 0 && 0 < (long)iVar7) {
      lVar8 = 0;
      do {
        lVar10 = (long)(int)uStack_290;
        uStack_290 = (char *)CONCAT44(uStack_290._4_4_,(int)uStack_290 + 1);
        *(vec2 *)(local_298 + lVar10 * 8) = ((vec_vec2_t *)((long)paVar13 + 0x40))->data[lVar8];
        lVar8 = lVar8 + 1;
      } while (iVar7 != lVar8);
    }
    local_198 = local_288;
    local_1a8 = (golf_script_t *)local_298;
    pcStack_1a0 = uStack_290;
    snprintf(local_118,0x40,"%s",paVar13);
    local_d8 = local_1a8->path;
    pcStack_d0 = pcStack_1a0;
    local_c8 = local_198;
    pcVar12 = local_118;
    paVar13 = paVar11;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)paVar13 = *(undefined8 *)pcVar12;
      pcVar12 = pcVar12 + (ulong)bVar17 * -0x10 + 8;
      paVar13 = (anon_union_1216_8_ffe1ccc7_for_golf_entity_4 *)
                ((long)paVar13 + (ulong)bVar17 * -0x10 + 8);
    }
    local_c8 = (char *)0x0;
    pgStack_c0 = (golf_model_group_t *)0x0;
    local_d8 = (char *)0x0;
    pcStack_d0 = (char *)0x0;
    local_e8[0] = 0;
    local_e8[1] = 0;
    pgStack_e0 = (golf_geo_face_t *)0x0;
    pcStack_f0 = (char *)0x0;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_108._0_4_ = 1;
    local_108._4_4_ = 0;
    pvStack_100 = ((vec_vec2_t *)((long)paVar11 + 0x40))->data;
    local_f8 = (golf_geo_point_t *)((long)*(int *)((long)paVar11 + 0x48) << 3);
    sVar5 = sg_make_buffer((sg_buffer_desc *)local_118);
    ((sg_buffer *)((long)paVar11 + 0x58))->id = sVar5.id;
    gVar6 = entity->type;
  }
  if (gVar6 == WATER_ENTITY) {
    pgVar16 = &(entity->field_4).water.geo;
  }
  else if (gVar6 == GEO_ENTITY) {
    pgVar16 = &(entity->field_4).geo.geo;
  }
  else {
    pgVar16 = (golf_geo_t *)0x0;
  }
  if (__return_storage_ptr__->type == WATER_ENTITY) {
    local_1d8 = (void *)((long)&__return_storage_ptr__->field_4 + 0x88);
  }
  else if (__return_storage_ptr__->type == GEO_ENTITY) {
    local_1d8 = (void *)((long)&__return_storage_ptr__->field_4 + 0xb0);
  }
  else {
    local_1d8 = (void *)0x0;
  }
  if (pgVar16 != (golf_geo_t *)0x0) {
    local_238 = (char *)0x0;
    uStack_230 = 0;
    local_228 = "geo";
    local_1d0 = __return_storage_ptr__;
    if (0 < (pgVar16->points).length) {
      lVar10 = 0xc;
      lVar8 = 0;
      do {
        pgVar2 = (pgVar16->points).data;
        local_1f8 = *(golf_script_t **)((long)pgVar2 + lVar10 + -8);
        local_118._8_4_ = *(undefined4 *)(&pgVar2->active + lVar10);
        uStack_1f0 = 0;
        local_118._0_4_ = SUB84(local_1f8,0);
        local_118._4_4_ = SUB84(local_1f8,4);
        local_1e8 = CONCAT44(local_118._8_4_,local_118._4_4_);
        uStack_1e0 = 0;
        iVar7 = vec_expand_(&local_238,(int *)&uStack_230,(int *)((long)&uStack_230 + 4),0x10,
                            local_228);
        if (iVar7 == 0) {
          lVar9 = (long)(int)uStack_230;
          uStack_230 = CONCAT44(uStack_230._4_4_,(int)uStack_230 + 1);
          lVar9 = lVar9 * 0x10;
          pcVar12 = local_238 + lVar9;
          pcVar12[0] = '\x01';
          pcVar12[1] = '\0';
          pcVar12[2] = '\0';
          pcVar12[3] = '\0';
          *(undefined4 *)(local_238 + lVar9 + 4) = local_1f8._0_4_;
          *(undefined8 *)(local_238 + lVar9 + 8) = local_1e8;
        }
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar8 < (pgVar16->points).length);
    }
    local_258 = (char *)0x0;
    uStack_250 = 0;
    local_248 = "geo";
    if (0 < (pgVar16->faces).length) {
      lVar8 = 0;
      do {
        memcpy(local_118,(pgVar16->faces).data + lVar8,0x90);
        local_218 = (char *)0x0;
        aiStack_210[0] = 0;
        aiStack_210[1] = 0;
        local_208 = "face";
        lVar10 = (long)(int)local_c8;
        iVar7 = vec_reserve_po2_((char **)&local_218,aiStack_210,aiStack_210 + 1,4,(int)local_c8,
                                 "face");
        if (iVar7 == 0 && 0 < lVar10) {
          lVar9 = 0;
          do {
            lVar14 = (long)aiStack_210[0];
            aiStack_210[0] = aiStack_210[0] + 1;
            *(undefined4 *)(local_218 + lVar14 * 4) = *(undefined4 *)(pcStack_d0 + lVar9 * 4);
            lVar9 = lVar9 + 1;
          } while (lVar10 != lVar9);
        }
        local_278 = (char *)0x0;
        uStack_270 = (char *)0x0;
        local_268 = "face";
        lVar10 = (long)local_a8;
        iVar4 = vec_reserve_po2_(&local_278,(int *)&uStack_270,(int *)((long)&uStack_270 + 4),8,
                                 local_a8,"face");
        iVar7 = local_b8;
        if (iVar4 == 0 && 0 < lVar10) {
          lVar9 = 0;
          do {
            lVar14 = (long)(int)uStack_270;
            uStack_270 = (char *)CONCAT44(uStack_270._4_4_,(int)uStack_270 + 1);
            *(undefined8 *)(local_278 + lVar14 * 8) = *(undefined8 *)(local_b0 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while (lVar10 != lVar9);
        }
        local_1f8 = (golf_script_t *)local_94;
        local_1e8 = CONCAT44(local_1e8._4_4_,local_8c);
        local_288 = local_268;
        local_298 = local_278;
        uStack_290 = uStack_270;
        local_1c8 = (undefined4)local_218;
        uStack_1c4 = local_218._4_4_;
        iStack_1c0 = aiStack_210[0];
        uStack_1bc = aiStack_210[1];
        local_1b8 = local_208;
        local_1a8 = (golf_script_t *)CONCAT71(local_1a8._1_7_,1);
        snprintf((char *)((long)&local_1a8 + 1),0x40,"%s",local_118 + 1);
        local_150 = local_1b8;
        local_160 = CONCAT44(uStack_1c4,local_1c8);
        uStack_158 = CONCAT44(uStack_1bc,iStack_1c0);
        local_130 = local_288;
        local_140 = local_298;
        pcStack_138 = uStack_290;
        local_148 = iVar7;
        local_128 = 0;
        local_124 = local_1f8;
        local_11c = (undefined4)local_1e8;
        iVar7 = vec_expand_(&local_258,(int *)&uStack_250,(int *)((long)&uStack_250 + 4),0x90,
                            local_248);
        if (iVar7 == 0) {
          lVar10 = (long)(int)uStack_250;
          uStack_250 = CONCAT44(uStack_250._4_4_,(int)uStack_250 + 1);
          memcpy(local_258 + lVar10 * 0x90,&local_1a8,0x90);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (pgVar16->faces).length);
    }
    local_1f8 = (pgVar16->generator_data).script;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_108 = "geo";
    if (0 < (pgVar16->generator_data).args.length) {
      lVar8 = 0;
      lVar10 = 0;
      do {
        iVar7 = vec_expand_((char **)local_118,(int *)(local_118 + 8),(int *)(local_118 + 0xc),0x58,
                            local_108);
        if (iVar7 == 0) {
          lVar9 = (long)(int)local_118._8_4_;
          local_118._8_4_ = local_118._8_4_ + 1;
          pcVar12 = ((pgVar16->generator_data).args.data)->name + lVar8;
          puVar15 = (undefined8 *)(lVar9 * 0x58 + CONCAT44(local_118._4_4_,local_118._0_4_));
          for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
            *puVar15 = *(undefined8 *)pcVar12;
            pcVar12 = pcVar12 + ((ulong)bVar17 * -2 + 1) * 8;
            puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
          }
        }
        lVar10 = lVar10 + 1;
        lVar8 = lVar8 + 0x58;
      } while (lVar10 < (pgVar16->generator_data).args.length);
    }
    pcStack_190 = local_108;
    pcStack_1a0 = (char *)CONCAT44(local_118._4_4_,local_118._0_4_);
    local_198 = (char *)CONCAT44(local_118._12_4_,local_118._8_4_);
    local_1a8 = local_1f8;
    points.length = (int)uStack_230;
    points.capacity = uStack_230._4_4_;
    points.data = (golf_geo_point_t *)local_238;
    points.alloc_category = local_228;
    faces.length = (int)uStack_250;
    faces.capacity = uStack_250._4_4_;
    faces.data = (golf_geo_face_t *)local_258;
    faces.alloc_category = local_248;
    generator_data.args.data = (golf_geo_generator_data_arg_t *)pcStack_1a0;
    generator_data.script = local_1f8;
    generator_data.args.length = local_118._8_4_;
    generator_data.args.capacity = local_118._12_4_;
    generator_data.args.alloc_category = local_108;
    golf_geo((golf_geo_t *)local_118,points,faces,generator_data,pgVar16->is_water);
    pvVar3 = local_1d8;
    memcpy(local_1d8,(golf_geo_t *)local_118,0xe8);
    *(undefined1 *)((long)pvVar3 + 0x51) = 1;
    golf_model_dynamic_finalize((golf_model_t *)((long)pvVar3 + 0x58));
    __return_storage_ptr__ = local_1d0;
  }
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_make_copy(golf_entity_t *entity) {
    golf_entity_t entity_copy = *entity;

    golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
    golf_lightmap_section_t *lightmap_section_copy = golf_entity_get_lightmap_section(&entity_copy);
    if (lightmap_section) {
        vec_vec2_t uvs_copy;
        vec_init(&uvs_copy, "level");
        vec_pusharr(&uvs_copy, lightmap_section->uvs.data, lightmap_section->uvs.length);
        *lightmap_section_copy = golf_lightmap_section(lightmap_section->lightmap_name, uvs_copy);
        golf_lightmap_section_finalize(lightmap_section_copy);
    }

    golf_geo_t *geo = golf_entity_get_geo(entity);
    golf_geo_t *geo_copy = golf_entity_get_geo(&entity_copy);
    if (geo) {
        vec_golf_geo_point_t points_copy;
        vec_init(&points_copy, "geo");
        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t point = geo->points.data[i];
            golf_geo_point_t point_copy = golf_geo_point(point.position);
            vec_push(&points_copy, point_copy);
        }

        vec_golf_geo_face_t faces_copy;
        vec_init(&faces_copy, "geo");
        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];

            vec_int_t idx_copy;
            vec_init(&idx_copy, "face");
            vec_pusharr(&idx_copy, face.idx.data, face.idx.length);

            vec_vec2_t uvs_copy;
            vec_init(&uvs_copy, "face");
            vec_pusharr(&uvs_copy, face.uvs.data, face.uvs.length);

            golf_geo_face_t face_copy = golf_geo_face(face.material_name, idx_copy, face.uv_gen_type, uvs_copy, face.water_dir);
            vec_push(&faces_copy, face_copy);
        }

        golf_geo_generator_data_t generator_data_copy;
        {
            golf_script_t *script = geo->generator_data.script;
            vec_golf_geo_generator_data_arg_t args;
            vec_init(&args, "geo");
            for (int i = 0; i < geo->generator_data.args.length; i++) {
                vec_push(&args, geo->generator_data.args.data[i]);
            }
            generator_data_copy = golf_geo_generator_data(script, args);
        }

        *geo_copy = golf_geo(points_copy, faces_copy, generator_data_copy, geo->is_water);
        golf_geo_finalize(geo_copy);
    }

    return entity_copy;
}